

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trie.h
# Opt level: O3

void __thiscall puppup::trie::Gaddag::Gaddag(Gaddag *this,istream *fin)

{
  iterator __position;
  iterator __position_00;
  pointer plVar1;
  bool bVar2;
  undefined1 auVar3 [32];
  vector<long,std::allocator<long>> *this_00;
  char *pcVar4;
  char cVar5;
  long lVar6;
  istream *piVar7;
  ostream *poVar8;
  ulong uVar9;
  pointer plVar10;
  pointer pNVar11;
  long lVar12;
  size_type sVar13;
  size_type sVar14;
  nodeid nVar15;
  byte bVar16;
  iterator iVar17;
  pointer pvVar18;
  chr child_chr;
  chr child_chr_1;
  pointer plVar19;
  long lVar20;
  long lVar21;
  undefined1 auVar23 [16];
  undefined1 auVar24 [64];
  undefined1 auVar25 [64];
  undefined1 auVar26 [64];
  undefined8 extraout_XMM0_Qa;
  undefined1 extraout_var [56];
  string s;
  array<long,_26UL> stridx;
  long alStack_408 [83];
  undefined8 uStack_170;
  vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_> *local_168;
  vector<long,std::allocator<long>> *local_160;
  vector<long,_std::allocator<long>_> *local_158;
  vector<long,_std::allocator<long>_> *local_150;
  vector<long,_std::allocator<long>_> *local_148;
  long local_140;
  char *local_138;
  size_type local_130;
  char local_128;
  undefined7 uStack_127;
  long local_118;
  long local_110;
  long local_108;
  undefined1 local_100 [208];
  undefined1 auVar22 [16];
  
  auVar24 = vpbroadcastq_avx512f(ZEXT816(0x1a));
  auVar25 = vpbroadcastq_avx512f(ZEXT816(8));
  local_168 = &this->nodes_;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->val_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->val_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->val_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->next_sibling_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->first_child_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->val_).super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->words_).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->words_).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->words_).
  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nodes_).
  super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  auVar26 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
  local_148 = &this->next_sibling_;
  local_158 = &this->first_child_;
  local_150 = &this->val_;
  lVar6 = 0;
  do {
    uVar9 = vpcmpuq_avx512f(auVar26,auVar24,1);
    auVar22 = vmovdqu8_avx512vl(*(undefined1 (*) [16])("eiaontrsuldgywvpmhfcbzxqkj_    +" + lVar6));
    auVar23[1] = ((byte)(uVar9 >> 1) & 1) * auVar22[1];
    auVar23[0] = ((byte)uVar9 & 1) * auVar22[0];
    auVar23[2] = ((byte)(uVar9 >> 2) & 1) * auVar22[2];
    auVar23[3] = ((byte)(uVar9 >> 3) & 1) * auVar22[3];
    auVar23[4] = ((byte)(uVar9 >> 4) & 1) * auVar22[4];
    auVar23[5] = ((byte)(uVar9 >> 5) & 1) * auVar22[5];
    auVar23[6] = ((byte)(uVar9 >> 6) & 1) * auVar22[6];
    auVar23[7] = (char)(uVar9 >> 7) * auVar22[7];
    auVar23._8_8_ = 0;
    lVar6 = lVar6 + 8;
    auVar3 = vpmovsxbd_avx2(auVar23);
    vpscatterdq_avx512f(ZEXT864(local_100) + ZEXT864(0xfffffffffffffcf8) +
                        ZEXT3264(auVar3) * (undefined1  [64])0x8,uVar9,auVar26);
    auVar26 = vpaddq_avx512f(auVar26,auVar25);
  } while (lVar6 != 0x20);
  local_138 = &local_128;
  local_130 = 0;
  local_128 = '\0';
  uStack_170 = 0x107498;
  std::
  vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
  ::reserve(&this->words_,200000);
  do {
    uStack_170 = 0x1074ad;
    cVar5 = std::ios::widen((char)*(undefined8 *)(*(long *)fin + -0x18) + (char)fin);
    auVar24._8_56_ = extraout_var;
    auVar24._0_8_ = extraout_XMM0_Qa;
    uStack_170 = 0x1074bd;
    piVar7 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       (fin,(string *)&local_138,cVar5);
    if (((byte)piVar7[*(long *)(*(long *)piVar7 + -0x18) + 0x20] & 5) != 0) {
      uStack_170 = 0x107604;
      std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::reserve
                (local_168,
                 ((long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x5555555555555557);
      __position_00._M_current =
           (this->nodes_).
           super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position_00._M_current ==
          (this->nodes_).
          super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        uStack_170 = 0x107646;
        std::vector<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>::
        _M_realloc_insert<>(local_168,__position_00);
      }
      else {
        auVar25 = vpternlogd_avx512f(auVar24,auVar24,auVar24,0xff);
        auVar24 = vmovdqu64_avx512f(auVar25);
        *(undefined1 (*) [64])(((__position_00._M_current)->children)._M_elems + 0x18) = auVar24;
        auVar24 = vmovdqu64_avx512f(auVar25);
        *(undefined1 (*) [64])(((__position_00._M_current)->children)._M_elems + 0x10) = auVar24;
        auVar24 = vmovdqu64_avx512f(auVar25);
        *(undefined1 (*) [64])(((__position_00._M_current)->children)._M_elems + 8) = auVar24;
        auVar24 = vmovdqu64_avx512f(auVar25);
        *(undefined1 (*) [64])((__position_00._M_current)->children)._M_elems = auVar24;
        (this->nodes_).
        super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>.
        _M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
      }
      uStack_170 = 0x107660;
      std::vector<long,_std::allocator<long>_>::reserve
                (&this->node_to_word_,
                 ((long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish -
                  (long)(this->words_).
                        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x5555555555555557);
      uVar9 = (long)(this->words_).
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->words_).
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
      if (0 < (long)uVar9) {
        local_118 = (uVar9 >> 3) * -0x5555555555555555;
        local_118 = local_118 + (ulong)(local_118 == 0);
        lVar6 = 0;
        local_160 = (vector<long,std::allocator<long>> *)&this->node_to_word_;
        do {
          pvVar18 = (this->words_).
                    super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar21 = (long)*(pointer *)
                          ((long)&pvVar18[lVar6].super__Vector_base<long,_std::allocator<long>_>.
                                  _M_impl + 8) -
                   *(long *)&pvVar18[lVar6].super__Vector_base<long,_std::allocator<long>_>._M_impl
                   >> 3;
          if (-1 < lVar21) {
            pvVar18 = pvVar18 + lVar6;
            local_140 = -1;
            lVar12 = 0;
            local_110 = lVar6;
            do {
              local_108 = lVar12;
              if (local_140 < 0) {
                nVar15 = 0;
              }
              else {
                nVar15 = 0;
                do {
                  lVar6 = *(long *)(*(long *)&(pvVar18->
                                              super__Vector_base<long,_std::allocator<long>_>).
                                              _M_impl + -8 + lVar12 * 8);
                  uStack_170 = 0x1076ec;
                  add(this,nVar15,lVar6);
                  lVar20 = lVar12 + -1;
                  nVar15 = (local_168->
                           super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                           )._M_impl.super__Vector_impl_data._M_start[nVar15].children._M_elems
                           [lVar6];
                  bVar2 = 0 < lVar12;
                  lVar12 = lVar20;
                } while (lVar20 != 0 && bVar2);
              }
              uStack_170 = 0x107715;
              add(this,nVar15,0x1f);
              lVar6 = local_140 + 1;
              nVar15 = (local_168->
                       super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                       )._M_impl.super__Vector_impl_data._M_start[nVar15].children._M_elems[0x1f];
              local_140 = lVar6;
              if (lVar6 < lVar21) {
                do {
                  lVar12 = *(long *)(*(long *)&(pvVar18->
                                               super__Vector_base<long,_std::allocator<long>_>).
                                               _M_impl + lVar6 * 8);
                  uStack_170 = 0x107752;
                  add(this,nVar15,lVar12);
                  lVar6 = lVar6 + 1;
                  nVar15 = (local_168->
                           super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                           )._M_impl.super__Vector_impl_data._M_start[nVar15].children._M_elems
                           [lVar12];
                } while (lVar21 != lVar6);
              }
              this_00 = local_160;
              iVar17._M_current =
                   (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                   super__Vector_impl_data._M_finish;
              plVar10 = (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>.
                        _M_impl.super__Vector_impl_data._M_start;
              lVar12 = (long)iVar17._M_current - (long)plVar10;
              lVar6 = local_110;
              while (local_110 = lVar6, lVar12 >> 3 <= nVar15) {
                if (iVar17._M_current ==
                    (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  uStack_170 = 0x1077af;
                  std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                            (this_00,iVar17,&invalid);
                  plVar10 = (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>.
                            _M_impl.super__Vector_impl_data._M_start;
                  iVar17._M_current =
                       (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl
                       .super__Vector_impl_data._M_finish;
                }
                else {
                  *iVar17._M_current = -1;
                  iVar17._M_current = iVar17._M_current + 1;
                  (this->node_to_word_).super__Vector_base<long,_std::allocator<long>_>._M_impl.
                  super__Vector_impl_data._M_finish = iVar17._M_current;
                }
                lVar6 = local_110;
                lVar12 = (long)iVar17._M_current - (long)plVar10;
              }
              plVar10[nVar15] = lVar6;
              lVar12 = local_108 + 1;
            } while (local_140 != lVar21);
          }
          lVar6 = lVar6 + 1;
        } while (lVar6 != local_118);
      }
      sVar13 = (long)(this->nodes_).
                     super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->nodes_).
                     super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 8;
      uStack_170 = 0x10780c;
      std::vector<long,_std::allocator<long>_>::resize(local_148,sVar13);
      uStack_170 = 0x107819;
      std::vector<long,_std::allocator<long>_>::resize(local_158,sVar13);
      uStack_170 = 0x107826;
      std::vector<long,_std::allocator<long>_>::resize(local_150,sVar13);
      if (0 < (long)sVar13) {
        plVar10 = (local_148->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                  super__Vector_impl_data._M_start;
        sVar14 = 0;
        pNVar11 = (local_168->
                  super__Vector_base<puppup::trie::Gaddag::Node,_std::allocator<puppup::trie::Gaddag::Node>_>
                  )._M_impl.super__Vector_impl_data._M_start;
        plVar1 = (local_158->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        do {
          plVar19 = (local_150->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar6 = 0;
          do {
            lVar21 = (pNVar11->children)._M_elems[lVar6];
            if (lVar21 != -1) {
              plVar19[lVar21] = lVar6;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x20);
          lVar6 = 0;
          do {
            lVar21 = (pNVar11->children)._M_elems[lVar6];
            if (lVar21 != -1) {
              plVar1[sVar14] = lVar21;
              break;
            }
            lVar6 = lVar6 + 1;
          } while (lVar6 != 0x20);
          plVar19 = (local_148->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          lVar21 = 0;
          lVar6 = -1;
          do {
            lVar12 = (pNVar11->children)._M_elems[lVar21];
            lVar20 = lVar6;
            if ((lVar12 != -1) && (lVar20 = lVar12, lVar6 != -1)) {
              plVar19[lVar6] = lVar12;
            }
            lVar21 = lVar21 + 1;
            lVar6 = lVar20;
          } while (lVar21 != 0x20);
          plVar19 = plVar10 + lVar20;
          if (lVar20 == -1) {
            plVar19 = plVar1 + sVar14;
          }
          sVar14 = sVar14 + 1;
          pNVar11 = pNVar11 + 1;
          *plVar19 = -1;
        } while (sVar14 != sVar13);
      }
      if (local_138 != &local_128) {
        uStack_170 = 0x1078f7;
        operator_delete(local_138,CONCAT71(uStack_127,local_128) + 1);
      }
      return;
    }
    if (local_130 != 0) {
      sVar13 = 0;
      do {
        bVar16 = local_138[sVar13];
        if ((byte)(bVar16 + 0xbf) < 0x1a) {
          bVar16 = bVar16 | 0x20;
          local_138[sVar13] = bVar16;
        }
        if ((byte)(bVar16 + 0x85) < 0xe6) {
          uStack_170 = 0x10751f;
          poVar8 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)&std::cerr,local_138,local_130);
          uStack_170 = 0x107536;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar8 + -0x18) + (char)poVar8);
          uStack_170 = 0x107541;
          std::ostream::put((char)poVar8);
          uStack_170 = 0x107549;
          std::ostream::flush();
          break;
        }
        sVar13 = sVar13 + 1;
      } while (local_130 != sVar13);
    }
    __position._M_current =
         (this->words_).
         super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->words_).
        super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      uStack_170 = 0x107579;
      std::
      vector<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ::_M_realloc_insert<>(&this->words_,__position);
      pvVar18 = (this->words_).
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    }
    else {
      ((__position._M_current)->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      ((__position._M_current)->super__Vector_base<long,_std::allocator<long>_>)._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      pvVar18 = (this->words_).
                super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish + 1;
      (this->words_).
      super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pvVar18;
    }
    uStack_170 = 0x10758b;
    std::vector<long,_std::allocator<long>_>::reserve(pvVar18 + -1,local_130);
    sVar13 = local_130;
    pcVar4 = local_138;
    if (local_130 != 0) {
      sVar14 = 0;
      do {
        pvVar18 = (this->words_).
                  super__Vector_base<std::vector<long,_std::allocator<long>_>,_std::allocator<std::vector<long,_std::allocator<long>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        iVar17._M_current =
             pvVar18[-1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
             super__Vector_impl_data._M_finish;
        if (iVar17._M_current ==
            pvVar18[-1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage) {
          uStack_170 = 0x1075d5;
          std::vector<long,std::allocator<long>>::_M_realloc_insert<long_const&>
                    ((vector<long,std::allocator<long>> *)(pvVar18 + -1),iVar17,
                     alStack_408 + pcVar4[sVar14]);
        }
        else {
          *iVar17._M_current = alStack_408[pcVar4[sVar14]];
          pvVar18[-1].super__Vector_base<long,_std::allocator<long>_>._M_impl.
          super__Vector_impl_data._M_finish = iVar17._M_current + 1;
        }
        sVar14 = sVar14 + 1;
      } while (sVar13 != sVar14);
    }
  } while( true );
}

Assistant:

explicit Gaddag(std::istream& fin) {
        std::array<idx, 26> stridx;
        for (idx i = 0; i < 26; ++i) {
            stridx[idxstr[i] - 'a'] = i;
        }
        std::string s;
        words_.reserve(200'000);
        while (std::getline(fin, s)) {
            for (char& c : s) {
                if (c >= 'A' && c <= 'Z') {
                    c += 'a' - 'A';
                }
                if (c < 'a' || c > 'z') {
                    std::cerr << s << std::endl;
                    break;
                }
            }
            words_.emplace_back();
            words_.back().reserve(s.length());
            for (char c : s) {
                words_.back().push_back(stridx[c - 'a']);
            }
        }
        nodes_.reserve(5 * words_.size());
        nodes_.emplace_back();  // root
        node_to_word_.reserve(5 * words_.size());
        for (idx w = 0, wn = words_.size(); w < wn; ++w) {
            const auto& word = words_[w];
            const idx n = word.size();
            for (idx start = -1; start < n; ++start) {
                nodeid curr = 0;
                for (idx j = start; j >= 0; --j) {
                    const chr i = word[j];
                    add(curr, i);
                    curr = get(curr, i);
                }
                add(curr, rev_marker);
                curr = get(curr, rev_marker);
                for (idx j = start + 1; j < n; ++j) {
                    const chr i = word[j];
                    add(curr, i);
                    curr = get(curr, i);
                }
                while (curr >= idx(node_to_word_.size())) {
                    node_to_word_.push_back(invalid);
                }
                node_to_word_[curr] = w;
            }
        }
        const nodeid n_nodes = nodes_.size();
        next_sibling_.resize(n_nodes);
        first_child_.resize(n_nodes);
        val_.resize(n_nodes);
        for (nodeid node = 0; node < n_nodes; ++node) {
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    val_[child] = child_chr;
                }
            }
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    first_child_[node] = child;
                    break;
                }
            }
            nodeid last = invalid;
            for (chr child_chr = 0; child_chr < 32; ++child_chr) {
                nodeid child = get(node, child_chr);
                if (child != invalid) {
                    if (last != invalid) {
                        next_sibling_[last] = child;
                    }
                    last = child;
                }
            }
            if (last != invalid) {
                next_sibling_[last] = invalid;
            } else {
                first_child_[node] = invalid;
            }
        }
    }